

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

Pooling3DLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_pooling3d(NeuralNetworkLayer *this)

{
  Pooling3DLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x5b9) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x5b9;
    this_00 = (Pooling3DLayerParams *)operator_new(0x50);
    Pooling3DLayerParams::Pooling3DLayerParams(this_00);
    (this->layer_).pooling3d_ = this_00;
  }
  return (Pooling3DLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::Pooling3DLayerParams* NeuralNetworkLayer::mutable_pooling3d() {
  if (!has_pooling3d()) {
    clear_layer();
    set_has_pooling3d();
    layer_.pooling3d_ = new ::CoreML::Specification::Pooling3DLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.pooling3d)
  return layer_.pooling3d_;
}